

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_pgroup_destroy(Integer grp_id)

{
  int iVar1;
  bool bVar2;
  proc_list_t *ppVar3;
  int *piVar4;
  long lVar5;
  bool bVar6;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  ARMCI_Group_free(&PGRP_LIST[grp_id].group);
  piVar4 = &GA->p_handle;
  lVar5 = 1;
  do {
    if (piVar4[-0x82] == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = *piVar4 != (int)grp_id;
    }
    if (!bVar6) break;
    piVar4 = piVar4 + 0xda;
    bVar2 = lVar5 < _max_global_array;
    lVar5 = lVar5 + 1;
  } while (bVar2);
  if (!bVar6) {
    pnga_error("Attempt to destroy process group with attached GAs",grp_id);
  }
  ppVar3 = PGRP_LIST;
  iVar1 = PGRP_LIST[grp_id].actv;
  PGRP_LIST[grp_id].actv = 0;
  free(ppVar3[grp_id].map_proc_list);
  return (ulong)(iVar1 != 0);
}

Assistant:

logical pnga_pgroup_destroy(Integer grp_id)
{
  logical ret = TRUE;
  int i, ok;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/

#ifdef MSG_COMMS_MPI
       ARMCI_Group_free(&PGRP_LIST[grp_id].group);
#endif
  /* check to make sure there are no GAs that depend on this process group */
  i=0;
  ok = 1;
  do{
      if (GA[i].actv) {
        if(GA[i].p_handle == (int)grp_id && GA[i].actv) ok = 0;
      }
      i++;
  }while(i<_max_global_array && ok);
  if (!ok) pnga_error("Attempt to destroy process group with attached GAs",grp_id);
  
  if (PGRP_LIST[grp_id].actv == 0) {
    ret = FALSE;
  }
  PGRP_LIST[grp_id].actv = 0;

  /* Deallocate memory for lists */
  free(PGRP_LIST[grp_id].map_proc_list);
  return ret;
}